

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O2

ostream * lest::operator<<(ostream *os,optional<char> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  lest *this;
  char *chr;
  string *this_00;
  bool bVar4;
  allocator local_79;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  
  poVar3 = std::operator<<(os,"[optional:");
  bVar2 = v->has_value_;
  if (bVar2 == true) {
    this = (lest *)nonstd::optional_lite::optional<char>::operator*(v);
    to_string_abi_cxx11_(&local_78,this,chr);
    local_58[0] = &local_48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_48._8_8_ = local_78.field_2._8_8_;
    }
    else {
      local_58[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"[empty]",&local_79);
    paVar1 = &local_38.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == paVar1) {
      local_78.field_2._8_8_ = local_38.field_2._8_8_;
      local_38._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    local_78.field_2._M_allocated_capacity =
         (ulong)(uint7)local_38.field_2._M_allocated_capacity._1_7_ << 8;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    bVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p == &local_78.field_2;
    local_58[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_38._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (bVar4) {
      local_48._8_8_ = local_78.field_2._8_8_;
      local_58[0] = &local_48;
    }
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity =
       local_78.field_2._M_allocated_capacity & 0xffffffffffffff00;
  poVar3 = std::operator<<(poVar3,(string *)local_58);
  poVar3 = std::operator<<(poVar3,"]");
  std::__cxx11::string::~string((string *)local_58);
  this_00 = &local_78;
  if (bVar2 == false) {
    std::__cxx11::string::~string((string *)this_00);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  return poVar3;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}